

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CMU462::DynamicScene::Mesh::draw_pretty(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  float fVar2;
  double dVar3;
  _List_node_base *p_Var4;
  long lVar5;
  double in_XMM1_Qa;
  undefined4 uVar6;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> offsets;
  undefined1 local_68 [16];
  double local_58;
  Vector3D local_48;
  
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar1 = &(this->mesh).vertices;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar1) {
    fVar2 = *(float *)((long)&p_Var4[6]._M_prev + 4);
    Vertex::normal(&local_48,(Vertex *)(p_Var4 + 1));
    dVar3 = (double)fVar2;
    in_XMM1_Qa = local_48.z * dVar3;
    local_68._8_4_ = SUB84(dVar3 * local_48.y,0);
    local_68._0_8_ = dVar3 * local_48.x;
    local_68._12_4_ = (int)((ulong)(dVar3 * local_48.y) >> 0x20);
    local_58 = in_XMM1_Qa;
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
              (&offsets,(value_type *)local_68);
  }
  lVar5 = 0;
  p_Var4 = (_List_node_base *)plVar1;
  while( true ) {
    uVar6 = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
    p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar1) break;
    Vector3D::operator+=
              ((Vector3D *)&p_Var4[1]._M_prev,
               (Vector3D *)
               ((long)&(offsets.
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar5));
    lVar5 = lVar5 + 0x18;
  }
  glPushMatrix();
  glTranslatef((float)(this->super_SceneObject).position.x,
               CONCAT44(uVar6,(float)(this->super_SceneObject).position.y),
               (float)(this->super_SceneObject).position.z);
  glRotatef((float)(this->super_SceneObject).rotation.x,0x3f800000,0,0);
  glRotatef((float)(this->super_SceneObject).rotation.y,0,0x3f800000,0);
  uVar6 = 0;
  glRotatef((float)(this->super_SceneObject).rotation.z,0,0,0x3f800000);
  glScalef((float)(this->super_SceneObject).scale.x,
           CONCAT44(uVar6,(float)(this->super_SceneObject).scale.y),
           (float)(this->super_SceneObject).scale.z);
  if (this->bsdf == (BSDF *)0x0) {
    glBindTexture(0xde1,0);
    local_68._8_4_ = 0x3f800000;
    local_68._0_8_ = 0x3f8000003f800000;
    glMaterialfv(0x404,0x1201);
  }
  else {
    glBindTexture(0xde1,0);
    glMaterialfv(0x404,0x1201,&this->bsdf->rasterize_color);
  }
  glEnable(0xb50);
  glDisable(0xbe2);
  draw_faces(this,true);
  glPopMatrix();
  lVar5 = 0;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var4->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar1) {
    Vector3D::operator-=
              ((Vector3D *)&p_Var4[1]._M_prev,
               (Vector3D *)
               ((long)&(offsets.
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x + lVar5));
    lVar5 = lVar5 + 0x18;
  }
  std::_Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~_Vector_base
            (&offsets.super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>);
  return;
}

Assistant:

void Mesh::draw_pretty() {

  vector<Vector3D> offsets;

  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D offset = v->offset * v->normal();
    offsets.push_back(offset);
  }

  int i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position += offsets[i++];
  }

  glPushMatrix();
  glTranslatef(position.x, position.y, position.z);
  glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
  glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
  glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
  glScalef(scale.x, scale.y, scale.z);

  if (bsdf) {
    glBindTexture(GL_TEXTURE_2D, 0);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &bsdf->rasterize_color.r);
  } else {
    glBindTexture(GL_TEXTURE_2D, 0);
    Spectrum white = Spectrum(1., 1., 1.);
    glMaterialfv(GL_FRONT, GL_DIFFUSE, &white.r);
  }

	// Enable lighting for faces
  glEnable(GL_LIGHTING);
  glDisable(GL_BLEND);
  draw_faces(true);

  glPopMatrix();

  i = 0;
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    v->position -= offsets[i++];
  }
}